

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_3.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  istream *piVar2;
  pointer pdVar3;
  long lVar4;
  undefined1 auVar5 [16];
  pair<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
  pVar6;
  vector<double,_std::allocator<double>_> distances;
  double distance;
  double local_40;
  _Vector_base<double,_std::allocator<double>_> local_38;
  value_type local_20;
  
  local_38._M_impl.super__Vector_impl_data._M_start = (double *)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (double *)0x0;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Enter distances between city A and B separated by \'space\'. ");
  std::operator<<(poVar1,"To terminate input enter \'.\' and press \'enter\':\n");
  local_20 = 0.0;
  while( true ) {
    piVar2 = std::istream::_M_extract<double>((double *)&std::cin);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)&local_38,&local_20);
  }
  local_40 = 0.0;
  for (pdVar3 = local_38._M_impl.super__Vector_impl_data._M_start;
      pdVar3 != local_38._M_impl.super__Vector_impl_data._M_finish; pdVar3 = pdVar3 + 1) {
    local_40 = local_40 + *pdVar3;
  }
  pVar6 = std::
          __minmax_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    ();
  std::operator<<((ostream *)&std::cout,"Total distance: ");
  poVar1 = std::ostream::_M_insert<double>(local_40);
  std::operator<<(poVar1,"\nThe smallest distance: ");
  poVar1 = std::ostream::_M_insert<double>(*pVar6.first._M_current._M_current);
  std::operator<<(poVar1,"\nThe biggest distance: ");
  poVar1 = std::ostream::_M_insert<double>(*pVar6.second._M_current._M_current);
  std::operator<<(poVar1,"\nThe mean distance: ");
  lVar4 = (long)local_38._M_impl.super__Vector_impl_data._M_finish -
          (long)local_38._M_impl.super__Vector_impl_data._M_start >> 3;
  auVar5._8_4_ = (int)((long)local_38._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_38._M_impl.super__Vector_impl_data._M_start >> 0x23);
  auVar5._0_8_ = lVar4;
  auVar5._12_4_ = 0x45300000;
  std::ostream::_M_insert<double>
            (local_40 /
             ((auVar5._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0)));
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_38);
  return 0;
}

Assistant:

int main()
{
	std::vector<double> distances;
	std::cout << "Enter distances between city A and B separated by 'space'. "
			  << "To terminate input enter '.' and press 'enter':\n";
	for (double distance = 0; std::cin >> distance;)
	{
		distances.push_back(distance);
	}
	auto sum = std::accumulate(distances.begin(), distances.end(), 0.0);
	auto [min, max] = std::minmax_element(distances.begin(), distances.end());
	std::cout << "Total distance: "
			  << sum
			  << "\nThe smallest distance: " << *min
			  << "\nThe biggest distance: " << *max
			  << "\nThe mean distance: " << sum / distances.size();
	return 0;
}